

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  Expr *pEVar1;
  Select **ppSVar2;
  int iVar3;
  
  if (p != (Select *)0x0) {
    do {
      substExprList(pSubst,p->pEList);
      substExprList(pSubst,p->pGroupBy);
      substExprList(pSubst,p->pOrderBy);
      pEVar1 = substExpr(pSubst,p->pHaving);
      p->pHaving = pEVar1;
      pEVar1 = substExpr(pSubst,p->pWhere);
      p->pWhere = pEVar1;
      ppSVar2 = &p->pSrc->a[0].pSelect;
      for (iVar3 = p->pSrc->nSrc; 0 < iVar3; iVar3 = iVar3 + -1) {
        substSelect(pSubst,*ppSVar2,1);
        if ((*(byte *)((long)ppSVar2 + 0x15) & 4) != 0) {
          substExprList(pSubst,((anon_union_8_2_996c0f8d_for_u1 *)(ppSVar2 + 7))->pFuncArg);
        }
        ppSVar2 = ppSVar2 + 0xe;
      }
    } while ((doPrior != 0) && (p = p->pPrior, p != (Select *)0x0));
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(pSubst, pItem->pSelect, 1);
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}